

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

void INT_REVenable_auto_stone(CMConnection conn,EVstone stone_num,int period_sec,int period_usec)

{
  int iVar1;
  CManager cm;
  int in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  CManager in_RDI;
  EVenable_auto_stone_request request;
  CMFormat f;
  int cond;
  CMFormat in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  CManager in_stack_ffffffffffffffe0;
  int condition;
  
  memset(&stack0xffffffffffffffd0,0,0x10);
  iVar1 = INT_CMCondition_get(in_stack_ffffffffffffffe0,
                              (CMConnection)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  cm = (CManager)INT_CMlookup_format((CManager)in_RDI->transports,EVenable_auto_stone_req_formats);
  condition = in_ESI;
  if (cm == (CManager)0x0) {
    cm = (CManager)
         INT_CMregister_format
                   ((CManager)CONCAT44(in_ECX,in_EDX),(FMStructDescList)CONCAT44(in_ESI,iVar1));
  }
  INT_CMCondition_set_client_data(cm,in_ECX,(void *)CONCAT44(in_ESI,iVar1));
  INT_CMwrite((CMConnection)CONCAT44(in_ESI,iVar1),in_stack_ffffffffffffffc8,(void *)0x155eaf);
  INT_CMCondition_wait(in_RDI,condition);
  return;
}

Assistant:

extern void
INT_REVenable_auto_stone(CMConnection conn, EVstone stone_num, int period_sec, int period_usec)
{
    int cond;
    CMFormat f;
    EVenable_auto_stone_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVenable_auto_stone_req_formats);
    request.stone_num = stone_num;
    request.period_sec = period_sec;
    request.period_usec = period_usec;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVenable_auto_stone_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, NULL);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
}